

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache_storage.cpp
# Opt level: O2

void __thiscall
cppcms::impl::mem_cache<cppcms::impl::process_settings>::stats
          (mem_cache<cppcms::impl::process_settings> *this,uint *keys,uint *triggers)

{
  rdlock_guard lock;
  _Head_base<0UL,_cppcms::impl::shared_mutex_*,_false> local_28;
  
  local_28._M_head_impl =
       (this->access_lock)._M_t.
       super___uniq_ptr_impl<cppcms::impl::shared_mutex,_std::default_delete<cppcms::impl::shared_mutex>_>
       ._M_t.
       super__Tuple_impl<0UL,_cppcms::impl::shared_mutex_*,_std::default_delete<cppcms::impl::shared_mutex>_>
       .super__Head_base<0UL,_cppcms::impl::shared_mutex_*,_false>._M_head_impl;
  shared_mutex::rdlock(local_28._M_head_impl);
  *keys = (uint)this->size;
  *triggers = (uint)this->triggers_count;
  shared_mutex::shared_guard::~shared_guard((shared_guard *)&local_28);
  return;
}

Assistant:

virtual void stats(unsigned &keys,unsigned &triggers)
	{
		rdlock_guard lock(*access_lock);
		keys=size;
		triggers = triggers_count;
	}